

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_layout_mapping_right_basics.cpp
# Opt level: O0

void test_3d_static<1ul,1ul,30ul>(void)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  value_type vVar4;
  value_type vVar5;
  value_type vVar6;
  size_type sVar7;
  __tuple_element_t<0UL,_tuple<int,_int,_int>_> *p_Var8;
  __tuple_element_t<1UL,_tuple<int,_int,_int>_> *p_Var9;
  __tuple_element_t<2UL,_tuple<int,_int,_int>_> *p_Var10;
  long lVar11;
  tuple<int,_int,_int> *local_200;
  tuple<int,_int,_int> *local_1f8;
  tuple<int,_int,_int> *local_1f0;
  size_type local_1e8;
  unsigned_long local_1e0;
  value_type true_idx;
  int local_1d0;
  int i;
  int j;
  int k;
  tuple<int,_int,_int> dptr [30];
  size_type local_58;
  unsigned_long local_50;
  size_type local_48;
  int local_3c;
  size_type local_38;
  int local_2c;
  size_type local_28;
  int local_1c;
  size_type local_18;
  bool local_d;
  bool local_c;
  layout_mapping_right<std::experimental::dimensions<1UL,_1UL,_30UL>,_std::experimental::dimensions<1UL,_1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL,_0UL>_>
  local_b [2];
  layout_mapping_right<std::experimental::dimensions<1UL,_1UL,_30UL>,_std::experimental::dimensions<1UL,_1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL,_0UL>_>
  l;
  
  std::experimental::
  layout_mapping_right<std::experimental::dimensions<1UL,_1UL,_30UL>,_std::experimental::dimensions<1UL,_1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL,_0UL>_>
  ::layout_mapping_right(local_b);
  local_c = std::experimental::
            layout_mapping_right<std::experimental::dimensions<1UL,_1UL,_30UL>,_std::experimental::dimensions<1UL,_1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL,_0UL>_>
            ::is_regular();
  local_d = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
             ,0xce,"void test_3d_static() [X = 1UL, Y = 1UL, Z = 30UL]",&local_c,&local_d);
  local_18 = std::experimental::
             layout_mapping_right<std::experimental::dimensions<1UL,_1UL,_30UL>,_std::experimental::dimensions<1UL,_1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL,_0UL>_>
             ::stride(local_b,0);
  local_1c = 1;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(0))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
             ,0xd0,"void test_3d_static() [X = 1UL, Y = 1UL, Z = 30UL]",&local_18,&local_1c);
  local_28 = std::experimental::
             layout_mapping_right<std::experimental::dimensions<1UL,_1UL,_30UL>,_std::experimental::dimensions<1UL,_1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL,_0UL>_>
             ::stride(local_b,1);
  local_2c = 1;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(1))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
             ,0xd1,"void test_3d_static() [X = 1UL, Y = 1UL, Z = 30UL]",&local_28,&local_2c);
  local_38 = std::experimental::
             layout_mapping_right<std::experimental::dimensions<1UL,_1UL,_30UL>,_std::experimental::dimensions<1UL,_1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL,_0UL>_>
             ::stride(local_b,2);
  local_3c = 1;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(2))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
             ,0xd2,"void test_3d_static() [X = 1UL, Y = 1UL, Z = 30UL]",&local_38,&local_3c);
  local_48 = std::experimental::dimensions<1UL,_1UL,_30UL>::size
                       ((dimensions<1UL,_1UL,_30UL> *)local_b);
  local_50 = 0x1e;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.size())","X * Y * Z",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
             ,0xd4,"void test_3d_static() [X = 1UL, Y = 1UL, Z = 30UL]",&local_48,&local_50);
  local_58 = std::experimental::
             layout_mapping_right<std::experimental::dimensions<1UL,_1UL,_30UL>,_std::experimental::dimensions<1UL,_1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL,_0UL>_>
             ::span(local_b);
  dptr[0x1d].super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int>.
  super__Head_base<1UL,_int,_false>._M_head_impl = 0x1e;
  dptr[0x1d].super__Tuple_impl<0UL,_int,_int,_int>.super__Head_base<0UL,_int,_false>._M_head_impl =
       0;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.span())","X * Y * Z",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
             ,0xd5,"void test_3d_static() [X = 1UL, Y = 1UL, Z = 30UL]",&local_58,
             (unsigned_long *)
             &dptr[0x1d].super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int>.
              super__Head_base<1UL,_int,_false>);
  local_200 = (tuple<int,_int,_int> *)&j;
  do {
    std::tuple<int,_int,_int>::tuple<void,_true>(local_200);
    local_200 = local_200 + 1;
  } while (local_200 !=
           (tuple<int,_int,_int> *)
           &dptr[0x1d].super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int>.
            super__Head_base<1UL,_int,_false>);
  i = 0;
  while( true ) {
    uVar3 = (ulong)i;
    vVar4 = std::experimental::dimensions<1UL,_1UL,_30UL>::operator[]<int>
                      ((dimensions<1UL,_1UL,_30UL> *)local_b,2);
    if (vVar4 <= uVar3) break;
    local_1d0 = 0;
    while( true ) {
      uVar3 = (ulong)local_1d0;
      vVar4 = std::experimental::dimensions<1UL,_1UL,_30UL>::operator[]<int>
                        ((dimensions<1UL,_1UL,_30UL> *)local_b,1);
      if (vVar4 <= uVar3) break;
      true_idx._4_4_ = 0;
      while( true ) {
        uVar3 = (ulong)true_idx._4_4_;
        vVar4 = std::experimental::dimensions<1UL,_1UL,_30UL>::operator[]<int>
                          ((dimensions<1UL,_1UL,_30UL> *)local_b,0);
        if (vVar4 <= uVar3) break;
        vVar4 = std::experimental::dimensions<1UL,_1UL,_30UL>::operator[]<int>
                          ((dimensions<1UL,_1UL,_30UL> *)local_b,1);
        vVar5 = std::experimental::dimensions<1UL,_1UL,_30UL>::operator[]<int>
                          ((dimensions<1UL,_1UL,_30UL> *)local_b,2);
        lVar11 = (long)true_idx._4_4_;
        vVar6 = std::experimental::dimensions<1UL,_1UL,_30UL>::operator[]<int>
                          ((dimensions<1UL,_1UL,_30UL> *)local_b,2);
        local_1e0 = vVar4 * vVar5 * lVar11 + vVar6 * (long)local_1d0 + (long)i;
        local_1e8 = std::experimental::
                    layout_mapping_right<std::experimental::dimensions<1ul,1ul,30ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>>
                    ::index<int,int,int>
                              ((layout_mapping_right<std::experimental::dimensions<1ul,1ul,30ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>>
                                *)local_b,true_idx._4_4_,local_1d0,i);
        boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                  ("(l.index(i, j, k))","true_idx",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
                   ,0xe0,"void test_3d_static() [X = 1UL, Y = 1UL, Z = 30UL]",&local_1e8,&local_1e0)
        ;
        sVar7 = std::experimental::
                layout_mapping_right<std::experimental::dimensions<1ul,1ul,30ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>>
                ::index<int,int,int>
                          ((layout_mapping_right<std::experimental::dimensions<1ul,1ul,30ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>>
                            *)local_b,true_idx._4_4_,local_1d0,i);
        local_1f0 = (tuple<int,_int,_int> *)(&j + sVar7 * 3);
        local_1f8 = (tuple<int,_int,_int> *)(&j + local_1e0 * 3);
        boost::detail::test_eq_impl<std::tuple<int,int,int>*,std::tuple<int,int,int>*>
                  ("&(dptr[l.index(i, j, k)])","&(dptr[true_idx])",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
                   ,0xe2,"void test_3d_static() [X = 1UL, Y = 1UL, Z = 30UL]",&local_1f0,&local_1f8)
        ;
        iVar1 = true_idx._4_4_;
        sVar7 = std::experimental::
                layout_mapping_right<std::experimental::dimensions<1ul,1ul,30ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>>
                ::index<int,int,int>
                          ((layout_mapping_right<std::experimental::dimensions<1ul,1ul,30ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>>
                            *)local_b,true_idx._4_4_,local_1d0,i);
        p_Var8 = std::get<0ul,int,int,int>((tuple<int,_int,_int> *)(&j + sVar7 * 3));
        iVar2 = local_1d0;
        *p_Var8 = iVar1;
        sVar7 = std::experimental::
                layout_mapping_right<std::experimental::dimensions<1ul,1ul,30ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>>
                ::index<int,int,int>
                          ((layout_mapping_right<std::experimental::dimensions<1ul,1ul,30ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>>
                            *)local_b,true_idx._4_4_,local_1d0,i);
        p_Var9 = std::get<1ul,int,int,int>((tuple<int,_int,_int> *)(&j + sVar7 * 3));
        iVar1 = i;
        *p_Var9 = iVar2;
        sVar7 = std::experimental::
                layout_mapping_right<std::experimental::dimensions<1ul,1ul,30ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>>
                ::index<int,int,int>
                          ((layout_mapping_right<std::experimental::dimensions<1ul,1ul,30ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>>
                            *)local_b,true_idx._4_4_,local_1d0,i);
        p_Var10 = std::get<2ul,int,int,int>((tuple<int,_int,_int> *)(&j + sVar7 * 3));
        *p_Var10 = iVar1;
        sVar7 = std::experimental::
                layout_mapping_right<std::experimental::dimensions<1ul,1ul,30ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>>
                ::index<int,int,int>
                          ((layout_mapping_right<std::experimental::dimensions<1ul,1ul,30ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>>
                            *)local_b,true_idx._4_4_,local_1d0,i);
        p_Var8 = std::get<0ul,int,int,int>((tuple<int,_int,_int> *)(&j + sVar7 * 3));
        boost::detail::test_eq_impl<int,int>
                  ("(std::get<0>(dptr[l.index(i, j, k)]))","i",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
                   ,0xe8,"void test_3d_static() [X = 1UL, Y = 1UL, Z = 30UL]",p_Var8,
                   (int *)((long)&true_idx + 4));
        sVar7 = std::experimental::
                layout_mapping_right<std::experimental::dimensions<1ul,1ul,30ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>>
                ::index<int,int,int>
                          ((layout_mapping_right<std::experimental::dimensions<1ul,1ul,30ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>>
                            *)local_b,true_idx._4_4_,local_1d0,i);
        p_Var9 = std::get<1ul,int,int,int>((tuple<int,_int,_int> *)(&j + sVar7 * 3));
        boost::detail::test_eq_impl<int,int>
                  ("(std::get<1>(dptr[l.index(i, j, k)]))","j",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
                   ,0xe9,"void test_3d_static() [X = 1UL, Y = 1UL, Z = 30UL]",p_Var9,&local_1d0);
        sVar7 = std::experimental::
                layout_mapping_right<std::experimental::dimensions<1ul,1ul,30ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>>
                ::index<int,int,int>
                          ((layout_mapping_right<std::experimental::dimensions<1ul,1ul,30ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>>
                            *)local_b,true_idx._4_4_,local_1d0,i);
        p_Var10 = std::get<2ul,int,int,int>((tuple<int,_int,_int> *)(&j + sVar7 * 3));
        boost::detail::test_eq_impl<int,int>
                  ("(std::get<2>(dptr[l.index(i, j, k)]))","k",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
                   ,0xea,"void test_3d_static() [X = 1UL, Y = 1UL, Z = 30UL]",p_Var10,&i);
        true_idx._4_4_ = true_idx._4_4_ + 1;
      }
      local_1d0 = local_1d0 + 1;
    }
    i = i + 1;
  }
  return;
}

Assistant:

void test_3d_static()
{ // {{{
    layout_mapping_right<
        dimensions<X, Y, Z>, dimensions<1, 1, 1>, dimensions<0, 0, 0>
    >  const l{};

    BOOST_TEST_EQ((l.is_regular()), true);

    BOOST_TEST_EQ((l.stride(0)), 1);
    BOOST_TEST_EQ((l.stride(1)), 1);
    BOOST_TEST_EQ((l.stride(2)), 1);

    BOOST_TEST_EQ((l.size()), X * Y * Z);
    BOOST_TEST_EQ((l.span()), X * Y * Z);

    tuple<int, int, int> dptr[X * Y * Z];

    // Set all elements to a unique value.
    for (auto k = 0; k < l[2]; ++k)
    for (auto j = 0; j < l[1]; ++j)
    for (auto i = 0; i < l[0]; ++i)
    {
        auto const true_idx = (l[1]) * (l[2]) * (i) + (l[2]) * (j) + (k);

        BOOST_TEST_EQ((l.index(i, j, k)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j, k)]), &(dptr[true_idx])); 

        std::get<0>(dptr[l.index(i, j, k)]) = i;
        std::get<1>(dptr[l.index(i, j, k)]) = j;
        std::get<2>(dptr[l.index(i, j, k)]) = k;

        BOOST_TEST_EQ((std::get<0>(dptr[l.index(i, j, k)])), i); 
        BOOST_TEST_EQ((std::get<1>(dptr[l.index(i, j, k)])), j); 
        BOOST_TEST_EQ((std::get<2>(dptr[l.index(i, j, k)])), k); 
    }
}